

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

void Llb_ManPrintHisto(Llb_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  int local_20;
  uint local_1c;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Llb_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), (int)local_1c < iVar1;
      local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(p->pAig->vObjs,local_1c);
    if ((pvVar2 != (void *)0x0) && (iVar1 = Vec_IntEntry(p->vObj2Var,local_1c), -1 < iVar1)) {
      printf("%3d :",(ulong)local_1c);
      for (local_20 = 0; iVar1 = Vec_IntEntry(p->vVarBegs,local_1c), local_20 < iVar1;
          local_20 = local_20 + 1) {
        printf(" ");
      }
      for (; iVar1 = Vec_IntEntry(p->vVarEnds,local_1c), local_20 <= iVar1; local_20 = local_20 + 1)
      {
        iVar1 = Llb_ManGroupHasVar(p,local_20,local_1c);
        uVar3 = 0x2d;
        if (iVar1 != 0) {
          uVar3 = 0x2a;
        }
        printf("%c",uVar3);
      }
      printf("\n");
    }
  }
  return;
}

Assistant:

void Llb_ManPrintHisto( Llb_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, k;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( Vec_IntEntry(p->vObj2Var, i) < 0 )
            continue;
        printf( "%3d :", i );
        for ( k = 0; k < Vec_IntEntry(p->vVarBegs, i); k++ )
            printf( " " );
        for (      ; k <= Vec_IntEntry(p->vVarEnds, i); k++ )
            printf( "%c", Llb_ManGroupHasVar(p, k, i)? '*':'-' );
        printf( "\n" );
    }
}